

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

QString * operator+=(QString *a,
                    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>,_QString_&>,_const_char_(&)[31]>
                    *b)

{
  qsizetype qVar1;
  qsizetype qVar2;
  QChar *out;
  QString *in_RDI;
  long in_FS_OFFSET;
  QChar *it;
  qsizetype len;
  type *in_stack_ffffffffffffffa0;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffffa8;
  QString *pQVar3;
  QString *in_stack_ffffffffffffffb0;
  long asize;
  long local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = QString::size(in_RDI);
  qVar2 = QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>,_QString_&>,_const_char_(&)[31]>_>
          ::size(in_stack_ffffffffffffffa0);
  local_10 = qVar1 + qVar2;
  QString::detach((QString *)in_stack_ffffffffffffffa0);
  asize = local_10;
  QString::data_ptr(in_RDI);
  qVar1 = QArrayDataPointer<char16_t>::freeSpaceAtEnd(in_stack_ffffffffffffffa8);
  if (qVar1 < asize) {
    qVar1 = QString::capacity((QString *)0x1fa300);
    local_18 = qVar1 << 1;
    qMax<long_long>(&local_10,&local_18);
    QString::reserve(in_stack_ffffffffffffffb0,asize);
  }
  out = QString::data((QString *)in_stack_ffffffffffffffa0);
  QString::size(in_RDI);
  QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>,_QString_&>,_const_char_(&)[31]>_>
  ::appendTo<QChar>(in_stack_ffffffffffffffa0,(QChar **)out);
  pQVar3 = in_RDI;
  QString::constData((QString *)0x1fa374);
  QString::resize((longlong)pQVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}